

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

parser_error visuals_parse_cycle(parser *parser)

{
  char *__s2;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  size_t sVar4;
  char *__s;
  visuals_color_cycle *pvVar5;
  ulong uVar6;
  char *existing_name;
  size_t offset;
  char *existing_group;
  size_t current_group_index;
  size_t i;
  char *parsed_name;
  char *parsed_group;
  visuals_parse_context *context;
  parser *parser_local;
  
  pvVar2 = parser_priv(parser);
  if (pvVar2 == (void *)0x0) {
    parser_local._4_4_ = PARSE_ERROR_INTERNAL;
  }
  else {
    *(long *)((long)pvVar2 + 0x20) = *(long *)((long)pvVar2 + 0x20) + 1;
    if (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18)) {
      pcVar3 = parser_getsym(parser,"group");
      if ((pcVar3 == (char *)0x0) || (sVar4 = strlen(pcVar3), sVar4 == 0)) {
        parser_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
      }
      else {
        __s = parser_getsym(parser,"name");
        if ((__s == (char *)0x0) || (sVar4 = strlen(__s), sVar4 == 0)) {
          parser_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
        }
        else {
          if (*(long *)(*(long *)((long)pvVar2 + 0x10) + *(long *)((long)pvVar2 + 0x20) * 8) == 0) {
            pvVar5 = visuals_color_cycle_new(__s,0x20,0xff);
            *(visuals_color_cycle **)
             (*(long *)((long)pvVar2 + 0x10) + *(long *)((long)pvVar2 + 0x20) * 8) = pvVar5;
            if (*(long *)(*(long *)((long)pvVar2 + 0x10) + *(long *)((long)pvVar2 + 0x20) * 8) == 0)
            {
              return PARSE_ERROR_INTERNAL;
            }
          }
          existing_group = *(char **)((long)pvVar2 + 0x38);
          for (current_group_index = 0; current_group_index < *(ulong *)((long)pvVar2 + 0x38);
              current_group_index = current_group_index + 1) {
            if (*(long *)(*(long *)((long)pvVar2 + 0x30) + current_group_index * 8) == 0) {
              pcVar3 = string_make(pcVar3);
              *(char **)(*(long *)((long)pvVar2 + 0x30) + current_group_index * 8) = pcVar3;
              existing_group = (char *)current_group_index;
              break;
            }
            __s2 = *(char **)(*(long *)((long)pvVar2 + 0x30) + current_group_index * 8);
            if ((__s2 != (char *)0x0) && (iVar1 = strcmp(pcVar3,__s2), iVar1 == 0)) {
              existing_group = (char *)current_group_index;
              break;
            }
          }
          for (current_group_index = 0; current_group_index < 0x40;
              current_group_index = current_group_index + 1) {
            uVar6 = (long)existing_group * 0x40 + current_group_index;
            if (uVar6 < *(ulong *)((long)pvVar2 + 0x48)) {
              if (*(long *)(*(long *)((long)pvVar2 + 0x40) + uVar6 * 8) == 0) {
                *(undefined8 *)(*(long *)((long)pvVar2 + 0x40) + uVar6 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)pvVar2 + 0x10) + *(long *)((long)pvVar2 + 0x20) * 8);
                break;
              }
              pcVar3 = *(char **)(*(long *)(*(long *)((long)pvVar2 + 0x40) + uVar6 * 8) + 0x10);
              if ((pcVar3 != (char *)0x0) && (iVar1 = strcmp(__s,pcVar3), iVar1 == 0)) {
                *(undefined8 *)(*(long *)((long)pvVar2 + 0x40) + uVar6 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)pvVar2 + 0x10) + *(long *)((long)pvVar2 + 0x20) * 8);
                break;
              }
            }
          }
          *(undefined8 *)((long)pvVar2 + 0x28) = 0;
          parser_local._4_4_ = PARSE_ERROR_NONE;
        }
      }
    }
    else {
      parser_local._4_4_ = PARSE_ERROR_TOO_MANY_ENTRIES;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static enum parser_error visuals_parse_cycle(struct parser *parser)
{
	struct visuals_parse_context *context = parser_priv(parser);
	const char *parsed_group = NULL;
	const char *parsed_name = NULL;
	size_t i = 0;
	size_t current_group_index = 0;

	if (context == NULL) {
		return PARSE_ERROR_INTERNAL;
	}

	/* Move to the next available slot in the cycle list. This will start the
	 * list at 1 (instead of zero), but we need to use cycles_index to keep
	 * track of which cycle we will be adding colors to. */
	context->cycles_index++;

	if (context->cycles_index >= context->max_cycles) {
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}

	parsed_group = parser_getsym(parser, "group");

	if (parsed_group == NULL || strlen(parsed_group) == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	parsed_name = parser_getsym(parser, "name");

	if (parsed_name == NULL || strlen(parsed_name) == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	/* Create a new cycle with the maximum number of steps (if we can),
	 * otherwise bail. */
	if (context->cycles[context->cycles_index] == NULL) {
		context->cycles[context->cycles_index] = visuals_color_cycle_new(parsed_name,
																		 VISUALS_STEPS_MAX,
																		 VISUALS_INVALID_COLOR);

		if (context->cycles[context->cycles_index] == NULL) {
			return PARSE_ERROR_INTERNAL;
		}
	}

	/* Find the group that matches the parsed cycle's group or create a new one
	 * if not found. */
	current_group_index = context->max_groups;

	for (i = 0; i < context->max_groups; i++) {
		if (context->group_names[i] == NULL) {
			context->group_names[i] = string_make(parsed_group);
			current_group_index = i;
			break;
		}
		else {
			const char *existing_group = context->group_names[i];

			if (existing_group != NULL && streq(parsed_group, existing_group)) {
				current_group_index = i;
				break;
			}
		}
	}

	/* Assign the parsed cycle to its group. If a cycle with a matching name is
	 * found, the parsed cycle replaces that one, otherwise, it is added to the
	 * end of the group. */
	for (i = 0; i < VISUALS_CYCLES_MAX; i++) {
		size_t offset = current_group_index * VISUALS_CYCLES_MAX + i;

		if (offset >= context->max_group_cycles) {
			continue;
		}

		if (context->group_cycles[offset] == NULL) {
			context->group_cycles[offset] = context->cycles[context->cycles_index];
			break;
		}
		else {
			const char *existing_name = context->group_cycles[offset]->cycle_name;

			if (existing_name != NULL && streq(parsed_name, existing_name)) {
				context->group_cycles[offset] = context->cycles[context->cycles_index];
				break;
			}
		}
	}

	/* Reset the step index before we start adding colors to the cycle. */
	context->cycle_step_index = 0;

	return PARSE_ERROR_NONE;
}